

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BufferTestUtil::BufferVerifierBase::BufferVerifierBase
          (BufferVerifierBase *this,Context *context)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             context->m_testCtx->m_log);
  this->_vptr_BufferVerifierBase = (_func_int **)&PTR__BufferVerifierBase_00795490;
  this->m_context = context;
  (this->super_CallLogWrapper).m_enableLog = false;
  return;
}

Assistant:

BufferVerifierBase::BufferVerifierBase (Context& context)
	: CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_context			(context)
{
	enableLogging(LOG_VERIFIER_CALLS);
}